

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O1

FilterList * __thiscall eglu::FilterList::operator<<(FilterList *this,FilterList *other)

{
  long lVar1;
  long lVar2;
  size_t __n;
  
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)this;
  std::
  vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::resize((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
            *)this,(*(long *)(other + 8) - *(long *)other >> 3) + (lVar1 - lVar2 >> 3));
  __n = *(long *)(other + 8) - (long)*(void **)other;
  if (__n != 0) {
    memmove((void *)((lVar1 - lVar2) + *(long *)this),*(void **)other,__n);
  }
  return this;
}

Assistant:

FilterList& FilterList::operator<< (const FilterList& other)
{
	size_t oldEnd = m_rules.size();
	m_rules.resize(m_rules.size()+other.m_rules.size());
	std::copy(other.m_rules.begin(), other.m_rules.end(), m_rules.begin()+oldEnd);
	return *this;
}